

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_field_gens.cc
# Opt level: O0

unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
 __thiscall
google::protobuf::compiler::java::anon_unknown_16::MakeImmutableGenerator
          (anon_unknown_16 *this,FieldDescriptor *field,int messageBitIndex,int builderBitIndex,
          Context *context)

{
  bool bVar1;
  JavaType JVar2;
  Descriptor *descriptor;
  unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator>_>
  local_90;
  unique_ptr<google::protobuf::compiler::java::ImmutableStringFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableStringFieldGenerator>_>
  local_88;
  unique_ptr<google::protobuf::compiler::java::ImmutableEnumFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableEnumFieldGenerator>_>
  local_80;
  unique_ptr<google::protobuf::compiler::java::ImmutableMessageFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMessageFieldGenerator>_>
  local_78;
  unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator>_>
  local_70;
  unique_ptr<google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator>_>
  local_68;
  unique_ptr<google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator>_>
  local_60;
  unique_ptr<google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator>_>
  local_58;
  unique_ptr<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator>_>
  local_50;
  unique_ptr<google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator>_>
  local_48;
  unique_ptr<google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator>_>
  local_40;
  unique_ptr<google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator>_>
  local_38;
  unique_ptr<google::protobuf::compiler::java::ImmutableMapFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMapFieldGenerator>_>
  local_30;
  Context *local_28;
  Context *context_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *field_local;
  
  local_28 = context;
  context_local._0_4_ = builderBitIndex;
  context_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = field;
  field_local = (FieldDescriptor *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    JVar2 = GetJavaType(_builderBitIndex_local);
    if (JVar2 == JAVATYPE_STRING) {
      std::
      make_unique<google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                ((FieldDescriptor **)&local_48,&builderBitIndex_local,
                 (int *)((long)&context_local + 4),&context_local);
      std::
      unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
      ::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator,std::default_delete<google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator>,void>
                ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                  *)this,&local_48);
      std::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator>_>
      ::~unique_ptr(&local_48);
    }
    else if (JVar2 == JAVATYPE_ENUM) {
      std::
      make_unique<google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                ((FieldDescriptor **)&local_40,&builderBitIndex_local,
                 (int *)((long)&context_local + 4),&context_local);
      std::
      unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
      ::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator,std::default_delete<google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator>,void>
                ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                  *)this,&local_40);
      std::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator>_>
      ::~unique_ptr(&local_40);
    }
    else if (JVar2 == JAVATYPE_MESSAGE) {
      descriptor = FieldDescriptor::message_type(_builderBitIndex_local);
      bVar1 = IsMapEntry(descriptor);
      if (bVar1) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableMapFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_30,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableMapFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableMapFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_30);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableMapFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMapFieldGenerator>_>
        ::~unique_ptr(&local_30);
      }
      else {
        std::
        make_unique<google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_38,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator,std::default_delete<google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_38);
        std::
        unique_ptr<google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator>_>
        ::~unique_ptr(&local_38);
      }
    }
    else {
      std::
      make_unique<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                ((FieldDescriptor **)&local_50,&builderBitIndex_local,
                 (int *)((long)&context_local + 4),&context_local);
      std::
      unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
      ::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator,std::default_delete<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator>,void>
                ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                  *)this,&local_50);
      std::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator>_>
      ::~unique_ptr(&local_50);
    }
  }
  else {
    bVar1 = IsRealOneof(_builderBitIndex_local);
    if (bVar1) {
      JVar2 = GetJavaType(_builderBitIndex_local);
      if (JVar2 == JAVATYPE_STRING) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_68,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_68);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator>_>
        ::~unique_ptr(&local_68);
      }
      else if (JVar2 == JAVATYPE_ENUM) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_60,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_60);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator>_>
        ::~unique_ptr(&local_60);
      }
      else if (JVar2 == JAVATYPE_MESSAGE) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_58,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_58);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator>_>
        ::~unique_ptr(&local_58);
      }
      else {
        std::
        make_unique<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_70,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_70);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator>_>
        ::~unique_ptr(&local_70);
      }
    }
    else {
      JVar2 = GetJavaType(_builderBitIndex_local);
      if (JVar2 == JAVATYPE_STRING) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableStringFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_88,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableStringFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableStringFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_88);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableStringFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableStringFieldGenerator>_>
        ::~unique_ptr(&local_88);
      }
      else if (JVar2 == JAVATYPE_ENUM) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableEnumFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_80,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableEnumFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableEnumFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_80);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableEnumFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableEnumFieldGenerator>_>
        ::~unique_ptr(&local_80);
      }
      else if (JVar2 == JAVATYPE_MESSAGE) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableMessageFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_78,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableMessageFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableMessageFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_78);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableMessageFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMessageFieldGenerator>_>
        ::~unique_ptr(&local_78);
      }
      else {
        std::
        make_unique<google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_90,&builderBitIndex_local,
                   (int *)((long)&context_local + 4),&context_local);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>>
                    *)this,&local_90);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator>_>
        ::~unique_ptr(&local_90);
      }
    }
  }
  return (__uniq_ptr_data<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>,_true,_true>
          )(__uniq_ptr_data<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ImmutableFieldGenerator> MakeImmutableGenerator(
    const FieldDescriptor* field, int messageBitIndex, int builderBitIndex,
    Context* context) {
  if (field->is_repeated()) {
    switch (GetJavaType(field)) {
      case JAVATYPE_MESSAGE:
        if (IsMapEntry(field->message_type())) {
          return std::make_unique<ImmutableMapFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
        } else {
          return std::make_unique<RepeatedImmutableMessageFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
        }
      case JAVATYPE_ENUM:
        return std::make_unique<RepeatedImmutableEnumFieldGenerator>(
            field, messageBitIndex, builderBitIndex, context);
      case JAVATYPE_STRING:
        return std::make_unique<RepeatedImmutableStringFieldGenerator>(
            field, messageBitIndex, builderBitIndex, context);
      default:
        return std::make_unique<RepeatedImmutablePrimitiveFieldGenerator>(
            field, messageBitIndex, builderBitIndex, context);
    }
  } else {
    if (IsRealOneof(field)) {
      switch (GetJavaType(field)) {
        case JAVATYPE_MESSAGE:
          return std::make_unique<ImmutableMessageOneofFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
        case JAVATYPE_ENUM:
          return std::make_unique<ImmutableEnumOneofFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
        case JAVATYPE_STRING:
          return std::make_unique<ImmutableStringOneofFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
        default:
          return std::make_unique<ImmutablePrimitiveOneofFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
      }
    } else {
      switch (GetJavaType(field)) {
        case JAVATYPE_MESSAGE:
          return std::make_unique<ImmutableMessageFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
        case JAVATYPE_ENUM:
          return std::make_unique<ImmutableEnumFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
        case JAVATYPE_STRING:
          return std::make_unique<ImmutableStringFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
        default:
          return std::make_unique<ImmutablePrimitiveFieldGenerator>(
              field, messageBitIndex, builderBitIndex, context);
      }
    }
  }
}